

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSamples
          (AsciiParser *this,string *type_name,TimeSamples *ts_out)

{
  StreamReader *pSVar1;
  bool bVar2;
  uint64_t pos;
  int iVar3;
  char sep;
  char nc;
  char c;
  double timeVal;
  TimeSamples ts;
  char local_83;
  char local_82;
  char local_81;
  double local_80;
  TimeSamples local_78;
  storage_union local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint64_t local_38;
  
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_78._dirty = false;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  bVar2 = Expect(this,'{');
  if ((bVar2) && (bVar2 = SkipWhitespaceAndNewline(this,true), bVar2)) {
    do {
      pSVar1 = this->_sr;
      if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
      goto LAB_00391268;
      bVar2 = Char1(this,&local_81);
      if (!bVar2) goto LAB_003912fb;
      if (local_81 == '}') goto LAB_00391268;
      Rewind(this,1);
      bVar2 = ReadBasicType(this,&local_80);
      if (!bVar2) {
        local_58.dynamic = &local_48;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Parse time value failed.","");
        PushError(this,(string *)&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.dynamic != &local_48) {
          operator_delete(local_58.dynamic,(ulong)(local_48._M_allocated_capacity + 1));
        }
        goto LAB_003912fb;
      }
      bVar2 = SkipWhitespace(this);
      if (((!bVar2) || (bVar2 = Expect(this,':'), !bVar2)) || (bVar2 = SkipWhitespace(this), !bVar2)
         ) goto LAB_003912fb;
      local_48._M_allocated_capacity =
           (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_58.dynamic =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      bVar2 = ParseTimeSampleValue(this,type_name,(Value *)&local_58);
      iVar3 = 1;
      if ((bVar2) && (bVar2 = SkipWhitespace(this), bVar2)) {
        local_83 = '\0';
        bVar2 = Char1(this,&local_83);
        iVar3 = 1;
        if (bVar2) {
          if (local_83 != ',') {
            if (local_83 == '}') {
LAB_0039119e:
              tinyusdz::value::TimeSamples::add_sample(&local_78,local_80,(Value *)&local_58);
              iVar3 = 3;
              goto LAB_00391245;
            }
            Rewind(this,1);
            pos = CurrLoc(this);
            bVar2 = SkipWhitespaceAndNewline(this,true);
            if (bVar2) {
              local_38 = pos;
              bVar2 = Char1(this,&local_82);
              iVar3 = 1;
              if (!bVar2) goto LAB_00391245;
              pos = local_38;
              if (local_82 == '}') goto LAB_0039119e;
            }
            SeekTo(this,pos);
          }
          iVar3 = 1;
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (bVar2) {
            tinyusdz::value::TimeSamples::add_sample(&local_78,local_80,(Value *)&local_58);
            iVar3 = 0;
          }
        }
      }
LAB_00391245:
      if ((pointer)local_48._M_allocated_capacity != (pointer)0x0) {
        (**(code **)(local_48._M_allocated_capacity + 0x20))(&local_58);
      }
    } while (iVar3 == 0);
    if (iVar3 == 3) {
LAB_00391268:
      bVar2 = true;
      if (ts_out != (TimeSamples *)0x0) {
        local_48._M_allocated_capacity =
             (size_type)
             (ts_out->_samples).
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (ts_out->_samples).
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT71(local_78._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               local_78._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
        local_58.dynamic =
             (ts_out->_samples).
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58._8_8_ =
             (ts_out->_samples).
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (ts_out->_samples).
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (ts_out->_samples).
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT71(local_78._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                               local_78._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_1_);
        local_78._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_78._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        local_78._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_78._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&local_58);
        ts_out->_dirty = local_78._dirty;
      }
      goto LAB_003912fd;
    }
  }
LAB_003912fb:
  bVar2 = false;
LAB_003912fd:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&local_78);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTimeSamples(const std::string &type_name,
                                   value::TimeSamples *ts_out) {

  value::TimeSamples ts;

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    }

    Rewind(1);

    double timeVal;
    // -inf, inf and nan are handled.
    if (!ReadBasicType(&timeVal)) {
      PushError("Parse time value failed.");
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    if (!Expect(':')) {
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    value::Value value;
    if (!ParseTimeSampleValue(type_name, &value)) { // could be None(ValueBlock)
      return false;
    }

    // The last element may have separator ','
    {
      // Semicolon ';' is not allowed as a separator for timeSamples array
      // values.
      if (!SkipWhitespace()) {
        return false;
      }

      char sep{};
      if (!Char1(&sep)) {
        return false;
      }

      DCOUT("sep = " << sep);
      if (sep == '}') {
        // End of item
        ts.add_sample(timeVal, value);
        break;
      } else if (sep == ',') {
        // ok
      } else {
        Rewind(1);

        // Look ahead Newline + '}'
        auto loc = CurrLoc();

        if (SkipWhitespaceAndNewline()) {
          char nc;
          if (!Char1(&nc)) {
            return false;
          }

          if (nc == '}') {
            // End of item
            ts.add_sample(timeVal, value);
            break;
          }
        }

        // Rewind and continue parsing.
        SeekTo(loc);
      }
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    ts.add_sample(timeVal, value);
  }

  DCOUT("Parse TimeSamples success. # of items = " << ts.size());

  if (ts_out) {
    (*ts_out) = std::move(ts);
  }

  return true;
}